

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unewdata.cpp
# Opt level: O0

uint32_t udata_finish(UNewDataMemory *pData,UErrorCode *pErrorCode)

{
  UBool UVar1;
  int iVar2;
  uint32_t local_24;
  uint32_t fileLength;
  UErrorCode *pErrorCode_local;
  UNewDataMemory *pData_local;
  
  local_24 = 0;
  if ((pErrorCode != (UErrorCode *)0x0) && (UVar1 = U_FAILURE(*pErrorCode), UVar1 == '\0')) {
    if (pData != (UNewDataMemory *)0x0) {
      if (pData->file != (FileStream *)0x0) {
        local_24 = T_FileStream_size(pData->file);
        iVar2 = T_FileStream_error(pData->file);
        if (iVar2 == 0) {
          local_24 = local_24 - pData->headerSize;
        }
        else {
          *pErrorCode = U_FILE_ACCESS_ERROR;
        }
        T_FileStream_close(pData->file);
      }
      uprv_free_63(pData);
    }
    return local_24;
  }
  return 0;
}

Assistant:

U_CAPI uint32_t U_EXPORT2
udata_finish(UNewDataMemory *pData, UErrorCode *pErrorCode) {
    uint32_t fileLength=0;

    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }

    if(pData!=NULL) {
        if(pData->file!=NULL) {
            /* fflush(pData->file);*/
            fileLength=T_FileStream_size(pData->file);
            if(T_FileStream_error(pData->file)) {
                *pErrorCode=U_FILE_ACCESS_ERROR;
            } else {
                fileLength-=pData->headerSize;
            }
            T_FileStream_close(pData->file);
        }
        uprv_free(pData);
    }

    return fileLength;
}